

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  string local_e0 [8];
  string namespacedTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Self local_80;
  _Self local_78;
  undefined4 local_70;
  cmGeneratorTarget *local_60;
  cmGeneratorTarget *tgt;
  TargetOrString resolved;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  cmGeneratorTarget *target_local;
  string *input_local;
  cmExportFileGenerator *this_local;
  
  resolved.Target = (cmGeneratorTarget *)missingTargets;
  cmGeneratorTarget::ResolveTargetReference((TargetOrString *)&tgt,target,input);
  local_60 = (cmGeneratorTarget *)resolved.String.field_2._8_8_;
  if (resolved.String.field_2._8_8_ == 0) {
    std::__cxx11::string::operator=((string *)input,(string *)&tgt);
    this_local._7_1_ = false;
  }
  else {
    bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)resolved.String.field_2._8_8_);
    if (bVar1) {
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(local_60);
      std::__cxx11::string::operator=((string *)input,(string *)psVar3);
      this_local._7_1_ = true;
    }
    else {
      local_78._M_node =
           (_Base_ptr)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::find(&this->ExportedTargets,&local_60);
      local_80._M_node =
           (_Base_ptr)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::end(&this->ExportedTargets);
      bVar1 = std::operator!=(&local_78,&local_80);
      if (bVar1) {
        cmGeneratorTarget::GetExportName_abi_cxx11_
                  ((string *)((long)&namespacedTarget.field_2 + 8),local_60);
        std::operator+(&local_a0,&this->Namespace,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&namespacedTarget.field_2 + 8));
        std::__cxx11::string::operator=((string *)input,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)(namespacedTarget.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::string(local_e0);
        (*this->_vptr_cmExportFileGenerator[0xe])(this,local_e0,resolved.Target,target,local_60);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::operator=((string *)input,local_e0);
        }
        else {
          psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(local_60);
          std::__cxx11::string::operator=((string *)input,(string *)psVar3);
        }
        std::__cxx11::string::~string(local_e0);
      }
      this_local._7_1_ = true;
    }
  }
  local_70 = 1;
  cmGeneratorTarget::TargetOrString::~TargetOrString((TargetOrString *)&tgt);
  return this_local._7_1_;
}

Assistant:

bool cmExportFileGenerator::AddTargetNamespace(
  std::string& input, cmGeneratorTarget* target,
  std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget::TargetOrString resolved =
    target->ResolveTargetReference(input);

  cmGeneratorTarget* tgt = resolved.Target;
  if (!tgt) {
    input = resolved.String;
    return false;
  }

  if (tgt->IsImported()) {
    input = tgt->GetName();
    return true;
  }
  if (this->ExportedTargets.find(tgt) != this->ExportedTargets.end()) {
    input = this->Namespace + tgt->GetExportName();
  } else {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets, target, tgt);
    if (!namespacedTarget.empty()) {
      input = namespacedTarget;
    } else {
      input = tgt->GetName();
    }
  }
  return true;
}